

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O0

void UpdateUVIndex(list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *l,uint n)

{
  bool bVar1;
  reference pTVar2;
  TTUpdateInfo *info;
  _Self local_20;
  const_iterator it;
  uint n_local;
  list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *l_local;
  
  it._M_node._4_4_ = n;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::begin(l);
  while( true ) {
    info = (TTUpdateInfo *)
           std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::end(l);
    bVar1 = std::operator!=(&local_20,(_Self *)&info);
    if (!bVar1) break;
    pTVar2 = std::_List_const_iterator<Assimp::TTUpdateInfo>::operator*(&local_20);
    if (pTVar2->directShortcut == (uint *)0x0) {
      if (it._M_node._4_4_ == 0) {
        aiMaterial::AddProperty<int>
                  (pTVar2->mat,(int *)((long)&it._M_node + 4),1,"$tex.uvwsrc",pTVar2->semantic,
                   pTVar2->index);
      }
    }
    else {
      *pTVar2->directShortcut = it._M_node._4_4_;
    }
    std::_List_const_iterator<Assimp::TTUpdateInfo>::operator++(&local_20);
  }
  return;
}

Assistant:

void UpdateUVIndex(const std::list<TTUpdateInfo>& l, unsigned int n)
{
    // Don't set if == 0 && wasn't set before
    for (std::list<TTUpdateInfo>::const_iterator it = l.begin();it != l.end(); ++it) {
        const TTUpdateInfo& info = *it;

        if (info.directShortcut)
            *info.directShortcut = n;
        else if (!n)
        {
            info.mat->AddProperty<int>((int*)&n,1,AI_MATKEY_UVWSRC(info.semantic,info.index));
        }
    }
}